

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<const_double>::~Array(Array<const_double> *this)

{
  double *pdVar1;
  size_t sVar2;
  
  pdVar1 = this->ptr;
  if (pdVar1 != (double *)0x0) {
    sVar2 = this->size_;
    this->ptr = (double *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pdVar1,8,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }